

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double calc_kurtosis_internal<long_double>
                 (size_t cnt,int *x,int ncat,size_t *buffer_cnt,double *buffer_prob,
                 MissingAction missing_action,CategSplit cat_split_type,Xoshiro256PP *rnd_generator)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  long in_RCX;
  int in_EDX;
  long in_RDI;
  long in_R8;
  longdouble in_ST0;
  longdouble lVar4;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar5;
  longdouble lVar6;
  double dVar7;
  double in_XMM1_Qa;
  undefined1 auVar8 [16];
  double in_XMM2_Qa;
  int in_stack_00000008;
  int cat_2;
  int ncat_present;
  double p;
  int cat_1;
  size_t iternum;
  size_t ntry;
  UniformUnitInterval runif;
  longdouble w_this;
  longdouble coef2;
  longdouble coef;
  longdouble s4;
  longdouble s3;
  longdouble s2;
  longdouble s1;
  longdouble temp_v;
  int cat;
  longdouble cnt_l;
  double sum_kurt;
  Xoshiro256PP *in_stack_fffffffffffffe88;
  undefined2 in_stack_fffffffffffffe90;
  undefined6 in_stack_fffffffffffffe92;
  byte local_142;
  byte local_141;
  int local_118;
  int local_114;
  int local_104;
  ulong local_100;
  long local_f8;
  UniformUnitInterval local_e9;
  longdouble local_e8;
  longdouble local_d8;
  longdouble local_c8;
  longdouble local_b8;
  longdouble local_a8;
  longdouble local_98;
  longdouble local_88;
  longdouble local_78;
  int local_5c;
  longdouble local_58;
  double local_40;
  long local_30;
  int local_1c;
  ulong local_10;
  double local_8;
  
  local_40 = 0.0;
  local_10 = in_RDI - *(long *)(in_RCX + (long)in_EDX * 8);
  if (local_10 < 2) {
    local_8 = -INFINITY;
  }
  else {
    local_58 = (longdouble)(float)(&DAT_006c0110)[(long)local_10 < 0] + (longdouble)(long)local_10;
    for (local_5c = 0; local_5c < in_EDX; local_5c = local_5c + 1) {
      lVar1 = *(long *)(in_RCX + (long)local_5c * 8);
      *(double *)(in_R8 + (long)local_5c * 8) =
           (double)(((longdouble)(float)(&DAT_006c0110)[lVar1 < 0] + (longdouble)lVar1) / local_58);
    }
    if (in_stack_00000008 == 0) {
      local_30 = in_R8;
      local_1c = in_EDX;
      Xoshiro::UniformUnitInterval::UniformUnitInterval<int,int>(&local_e9,0,1);
      local_f8 = 0x32;
      for (local_100 = 0; local_100 < 0x32; local_100 = local_100 + 1) {
        local_a8 = (longdouble)0;
        local_b8 = local_a8;
        local_98 = local_a8;
        local_88 = local_a8;
        for (local_104 = 0; lVar4 = in_ST3, local_104 < local_1c; local_104 = local_104 + 1) {
          dVar7 = Xoshiro::UniformUnitInterval::operator()
                            ((UniformUnitInterval *)
                             CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90),
                             in_stack_fffffffffffffe88);
          local_c8 = (longdouble)dVar7;
          local_d8 = local_c8 * local_c8;
          local_e8 = (longdouble)*(double *)(local_30 + (long)local_104 * 8);
          lVar5 = in_ST4;
          dVar7 = std::fma(dVar7,in_XMM1_Qa,in_XMM2_Qa);
          lVar6 = lVar5;
          local_88 = in_ST0;
          dVar7 = std::fma(dVar7,in_XMM1_Qa,in_XMM2_Qa);
          in_ST0 = in_ST4;
          in_ST3 = lVar6;
          local_98 = in_ST1;
          dVar7 = std::fma(dVar7,in_XMM1_Qa,in_XMM2_Qa);
          in_ST1 = lVar5;
          in_stack_fffffffffffffe88 = SUB108(local_e8,0);
          in_stack_fffffffffffffe90 = (undefined2)((unkuint10)local_e8 >> 0x40);
          in_ST4 = in_ST3;
          local_a8 = in_ST2;
          std::fma(dVar7,in_XMM1_Qa,in_XMM2_Qa);
          in_ST2 = lVar6;
          local_b8 = lVar4;
        }
        local_78 = local_98 - local_88 * local_88;
        if ((longdouble)0 < local_78) {
          lVar4 = local_88 * local_88 * local_88;
          local_40 = (double)((longdouble)local_40 +
                             ((((longdouble)6.0 * local_98 * local_88 * local_88 +
                               (local_b8 - local_a8 * (longdouble)4.0 * local_88)) -
                              (longdouble)4.0 * local_88 * lVar4) + lVar4 * local_88) /
                             (local_78 * local_78));
          in_ST3 = in_ST2;
          in_ST4 = in_ST2;
        }
        else {
          local_f8 = local_f8 + -1;
          in_ST3 = lVar4;
        }
      }
      if (local_f8 == 0) {
        local_8 = -INFINITY;
      }
      else {
        uVar2 = std::isnan(local_40);
        local_141 = 1;
        if ((uVar2 & 1) == 0) {
          iVar3 = std::isinf(local_40);
          local_141 = (byte)iVar3;
        }
        if ((local_141 & 1) == 0) {
          if (local_40 <= 0.0) {
            local_40 = 0.0;
          }
          auVar8._8_4_ = (int)((ulong)local_f8 >> 0x20);
          auVar8._0_8_ = local_f8;
          auVar8._12_4_ = 0x45300000;
          local_8 = local_40 /
                    ((auVar8._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)local_f8) - 4503599627370496.0));
        }
        else {
          local_8 = -INFINITY;
        }
      }
    }
    else {
      local_114 = in_EDX;
      for (local_118 = 0; local_118 < in_EDX; local_118 = local_118 + 1) {
        dVar7 = *(double *)(in_R8 + (long)local_118 * 8);
        if ((dVar7 != 0.0) || (NAN(dVar7))) {
          local_40 = (dVar7 * dVar7 * dVar7 * dVar7 +
                     -(dVar7 * 4.0) * dVar7 * dVar7 * dVar7 +
                     dVar7 * 6.0 * dVar7 * dVar7 + -(dVar7 * 4.0) * dVar7 + dVar7) /
                     ((-dVar7 * dVar7 + dVar7) * (-dVar7 * dVar7 + dVar7)) + local_40;
        }
        else {
          local_114 = local_114 + -1;
        }
      }
      if (local_114 < 2) {
        local_8 = -INFINITY;
      }
      else {
        uVar2 = std::isnan(local_40);
        local_142 = 1;
        if ((uVar2 & 1) == 0) {
          iVar3 = std::isinf(local_40);
          local_142 = (byte)iVar3;
        }
        if ((local_142 & 1) == 0) {
          if (local_40 <= 0.0) {
            local_40 = 0.0;
          }
          local_8 = local_40 / (double)local_114;
        }
        else {
          local_8 = -INFINITY;
        }
      }
    }
  }
  return local_8;
}

Assistant:

double calc_kurtosis_internal(size_t cnt, int x[], int ncat, size_t buffer_cnt[], double buffer_prob[],
                              MissingAction missing_action, CategSplit cat_split_type, RNG_engine &rnd_generator)
{
    /* This calculation proceeds as follows:
        - If splitting by subsets, it will assign a random weight ~Unif(0,1) to
          each category, and approximate kurtosis by sampling from such distribution
          with the same probabilities as given by the current counts.
        - If splitting by isolating one category, will binarize at each categorical level,
          assume the values are zero or one, and output the average assuming each categorical
          level has equal probability of being picked.
        (Note that both are misleading heuristics, but might be better than random)
    */
    double sum_kurt = 0;

    cnt -= buffer_cnt[ncat];
    if (cnt <= 1) return -HUGE_VAL;
    ldouble_safe cnt_l = (ldouble_safe) cnt;
    for (int cat = 0; cat < ncat; cat++)
        buffer_prob[cat] = buffer_cnt[cat] / cnt_l;

    switch (cat_split_type)
    {
        case SubSet:
        {
            ldouble_safe temp_v;
            ldouble_safe s1, s2, s3, s4;
            ldouble_safe coef;
            ldouble_safe coef2;
            ldouble_safe w_this;
            UniformUnitInterval runif(0, 1);
            size_t ntry = 50;
            for (size_t iternum = 0; iternum < 50; iternum++)
            {
                s1 = 0; s2 = 0; s3 = 0; s4 = 0;
                for (int cat = 0; cat < ncat; cat++)
                {
                    coef = runif(rnd_generator);
                    coef2 = coef * coef;
                    w_this = buffer_prob[cat];
                    s1 = std::fma(w_this, coef, s1);
                    s2 = std::fma(w_this, coef2, s2);
                    s3 = std::fma(w_this, coef2*coef, s3);
                    s4 = std::fma(w_this, coef2*coef2, s4);
                    // s1 += buffer_prob[cat] * pw1(coef);
                    // s2 += buffer_prob[cat] * pw2(coef);
                    // s3 += buffer_prob[cat] * pw3(coef);
                    // s4 += buffer_prob[cat] * pw4(coef);
                }
                temp_v = s2 - pw2(s1);
                if (temp_v <= 0)
                    ntry--;
                else
                    sum_kurt += (s4 - 4 * s3 * pw1(s1) + 6 * s2 * pw2(s1) - 4 * s1 * pw3(s1) + pw4(s1)) / pw2(temp_v);
            }
            if (unlikely(!ntry))
                return -HUGE_VAL;
            else if (unlikely(is_na_or_inf(sum_kurt)))
                return -HUGE_VAL;
            else
                return std::fmax(sum_kurt, 0.) / (double)ntry;
        }

        case SingleCateg:
        {
            double p;
            int ncat_present = ncat;
            for (int cat = 0; cat < ncat; cat++)
            {
                p = buffer_prob[cat];
                if (p == 0)
                    ncat_present--;
                else
                    sum_kurt += (p - 4 * p * pw1(p) + 6 * p * pw2(p) - 4 * p * pw3(p) + pw4(p)) / pw2(p - pw2(p));
            }
            if (ncat_present <= 1)
                return -HUGE_VAL;
            else if (unlikely(is_na_or_inf(sum_kurt)))
                return -HUGE_VAL;
            else
                return std::fmax(sum_kurt, 0.) / (double)ncat_present;
        }
    }

    unreachable();
    return -1; /* this will never be reached, but CRAN complains otherwise */
}